

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Roboteq.h
# Opt level: O3

int SetAllPWMsRoboteq(ROBOTEQ *pRoboteq,int *selectedchannels,int *pws)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int pws_tmp [3];
  char command [10];
  char args [50];
  char response [256];
  undefined8 local_190;
  int local_188;
  char local_182 [10];
  char local_178 [64];
  char local_138 [264];
  
  local_188 = pws[2];
  local_190 = *(undefined8 *)pws;
  lVar6 = 0;
  bVar1 = false;
  iVar7 = 0;
  do {
    if (selectedchannels[lVar6] != 0) {
      iVar3 = (int)((double)(*(int *)((long)&local_190 + lVar6 * 4) + -0x5dc) *
                   pRoboteq->CoefPWs[lVar6]);
      if (pRoboteq->bProportionalPWs[lVar6] == 0) {
        iVar4 = iVar3 + 0x5dc;
      }
      else {
        iVar4 = pRoboteq->MidPWs[lVar6];
        if (iVar3 < 0) {
          iVar3 = (int)((ulong)((long)((pRoboteq->MinPWs[lVar6] - iVar4) * iVar3) * -0x10624dd3) >>
                       0x20);
        }
        else {
          iVar3 = (int)((ulong)((long)((pRoboteq->MaxPWs[lVar6] - iVar4) * iVar3) * 0x10624dd3) >>
                       0x20);
        }
        iVar4 = ((iVar3 >> 5) - (iVar3 >> 0x1f)) + iVar4;
      }
      if (pRoboteq->MaxPWs[lVar6] <= iVar4) {
        iVar4 = pRoboteq->MaxPWs[lVar6];
      }
      if (iVar4 <= pRoboteq->MinPWs[lVar6]) {
        iVar4 = pRoboteq->MinPWs[lVar6];
      }
      *(int *)((long)&local_190 + lVar6 * 4) = iVar4;
      iVar5 = iVar4 - pRoboteq->LastPWs[lVar6];
      iVar3 = -iVar5;
      if (0 < iVar5) {
        iVar3 = iVar5;
      }
      if (pRoboteq->ThresholdPWs[lVar6] <= iVar3) {
        bVar2 = !bVar1;
        bVar1 = true;
        if (bVar2) {
          sprintf(local_182,"$%02X",0);
          sprintf(local_178,"%i %i",(ulong)((int)lVar6 + 1),(ulong)(iVar4 * 2 - 3000));
          iVar3 = IssueCommandRoboteq(pRoboteq,"!",local_182,local_178,10,local_138,1);
          bVar1 = true;
          if ((iVar3 == 0) && (bVar1 = false, local_138[0] != '+')) {
            puts("Error reading data from a Roboteq : Command not recognized or lost. ");
            bVar1 = true;
          }
        }
        iVar7 = iVar7 + 1;
      }
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  if (iVar7 != 0) {
    if (bVar1) {
      return 1;
    }
    lVar6 = 0;
    do {
      if (selectedchannels[lVar6] != 0) {
        iVar7 = *(int *)((long)&local_190 + lVar6 * 4);
        iVar4 = iVar7 - pRoboteq->LastPWs[lVar6];
        iVar3 = -iVar4;
        if (0 < iVar4) {
          iVar3 = iVar4;
        }
        if (pRoboteq->ThresholdPWs[lVar6] <= iVar3) {
          pRoboteq->LastPWs[lVar6] = iVar7;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
  }
  return 0;
}

Assistant:

inline int SetAllPWMsRoboteq(ROBOTEQ* pRoboteq, int* selectedchannels, int* pws)
{
	int channel = 0;
	int pws_tmp[NB_CHANNELS_PWM_ROBOTEQ];
	int nbselectedchannels = 0;
	int res = EXIT_SUCCESS;

	nbselectedchannels = 0;

	memcpy(pws_tmp, pws, sizeof(pws_tmp));

	for (channel = 0; channel < NB_CHANNELS_PWM_ROBOTEQ; channel++)
	{
		if (!selectedchannels[channel]) continue;

		if (pRoboteq->bProportionalPWs[channel])
		{
			pws_tmp[channel] = (int)(pRoboteq->CoefPWs[channel]*(pws_tmp[channel]-DEFAULT_MID_PW_ROBOTEQ));
			if (pws_tmp[channel] >= 0)
				pws_tmp[channel] = pRoboteq->MidPWs[channel]+pws_tmp[channel]*(pRoboteq->MaxPWs[channel]-pRoboteq->MidPWs[channel])
				/(DEFAULT_MAX_PW_ROBOTEQ-DEFAULT_MID_PW_ROBOTEQ);
			else
				pws_tmp[channel] = pRoboteq->MidPWs[channel]+pws_tmp[channel]*(pRoboteq->MinPWs[channel]-pRoboteq->MidPWs[channel])
				/(DEFAULT_MIN_PW_ROBOTEQ-DEFAULT_MID_PW_ROBOTEQ);
		}
		else
		{
			pws_tmp[channel] = DEFAULT_MID_PW_ROBOTEQ+(int)(pRoboteq->CoefPWs[channel]*(pws_tmp[channel]-DEFAULT_MID_PW_ROBOTEQ));
		}

		pws_tmp[channel] = max(min(pws_tmp[channel], pRoboteq->MaxPWs[channel]), pRoboteq->MinPWs[channel]);
		//pws_tmp[channel] = max(min(pws_tmp[channel], DEFAULT_ABSOLUTE_MAX_PW_ROBOTEQ), DEFAULT_ABSOLUTE_MIN_PW_ROBOTEQ);

		// The requested PWM is only applied if it is slightly different from the current value.
		if (abs(pws_tmp[channel]-pRoboteq->LastPWs[channel]) < pRoboteq->ThresholdPWs[channel]) continue;

		//printf("%d %d %d %d %d\n", channel, pws_tmp[channel], pRoboteq->LastPWs[channel], abs(pws_tmp[channel]-pRoboteq->LastPWs[channel]), pRoboteq->ThresholdPWs[channel]);
		
		res = (res || SetCommandRoboteq(pRoboteq, _GO_ROBOTEQ, channel+1, 2*(pws_tmp[channel]-DEFAULT_MID_PW_ROBOTEQ)*(DEFAULT_MAX_PW_ROBOTEQ-DEFAULT_MIN_PW_ROBOTEQ)/1000));

		nbselectedchannels++;
	}

	if (nbselectedchannels == 0) return EXIT_SUCCESS;
	
	if (res != EXIT_SUCCESS) return res;

	for (channel = 0; channel < NB_CHANNELS_PWM_ROBOTEQ; channel++)
	{
		if (!selectedchannels[channel]) continue;

		// The requested PWM should have been only applied if it was slightly different from the current value.
		if (abs(pws_tmp[channel]-pRoboteq->LastPWs[channel]) < pRoboteq->ThresholdPWs[channel]) continue;

		// Update last known value.
		pRoboteq->LastPWs[channel] = pws_tmp[channel];
	}

	return EXIT_SUCCESS;
}